

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O3

UBool __thiscall icu_63::OlsonTimeZone::useDaylightTime(OlsonTimeZone *this)

{
  int32_t *piVar1;
  uint8_t *puVar2;
  ushort uVar3;
  int iVar4;
  int64_t iVar5;
  long lVar6;
  ulong uVar7;
  UDate time;
  double dVar8;
  double dVar9;
  double dVar10;
  int32_t mid;
  int32_t doy;
  int32_t dow;
  int32_t dom;
  int32_t month;
  int32_t year;
  int32_t local_48;
  int32_t local_44;
  int32_t local_40;
  int32_t local_3c;
  int32_t local_38;
  int32_t local_34;
  
  time = uprv_getUTCtime_63();
  if ((this->finalZone != (SimpleTimeZone *)0x0) && (this->finalStartMillis <= time)) {
    iVar4 = (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[9])
                      ();
    return (UBool)iVar4;
  }
  Grego::timeToFields(time,&local_34,&local_38,&local_3c,&local_40,&local_44,&local_48);
  dVar8 = Grego::fieldsToDay(local_34,0,1);
  dVar9 = Grego::fieldsToDay(local_34 + 1,0,1);
  uVar3 = this->transitionCount32 + this->transitionCountPre32 + this->transitionCountPost32;
  if (0 < (short)uVar3) {
    piVar1 = this->typeOffsets;
    puVar2 = this->typeMapData;
    uVar7 = 0;
    do {
      iVar5 = transitionTimeInSeconds(this,(int16_t)uVar7);
      dVar10 = (double)iVar5;
      if (dVar9 * 86400.0 <= dVar10) {
        return '\0';
      }
      if ((dVar8 * 86400.0 <= dVar10) && (piVar1[(ulong)puVar2[uVar7] * 2 + 1] != 0)) {
        return '\x01';
      }
      if (dVar8 * 86400.0 < dVar10) {
        if (uVar7 == 0) {
          lVar6 = 1;
        }
        else {
          lVar6 = (ulong)puVar2[uVar7 - 1] * 2 + 1;
        }
        if (piVar1[lVar6] != 0) {
          return '\x01';
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
  }
  return '\0';
}

Assistant:

UBool OlsonTimeZone::useDaylightTime() const {
    // If DST was observed in 1942 (for example) but has never been
    // observed from 1943 to the present, most clients will expect
    // this method to return FALSE.  This method determines whether
    // DST is in use in the current year (at any point in the year)
    // and returns TRUE if so.

    UDate current = uprv_getUTCtime();
    if (finalZone != NULL && current >= finalStartMillis) {
        return finalZone->useDaylightTime();
    }

    int32_t year, month, dom, dow, doy, mid;
    Grego::timeToFields(current, year, month, dom, dow, doy, mid);

    // Find start of this year, and start of next year
    double start = Grego::fieldsToDay(year, 0, 1) * SECONDS_PER_DAY;
    double limit = Grego::fieldsToDay(year+1, 0, 1) * SECONDS_PER_DAY;

    // Return TRUE if DST is observed at any time during the current
    // year.
    for (int16_t i = 0; i < transitionCount(); ++i) {
        double transition = (double)transitionTimeInSeconds(i);
        if (transition >= limit) {
            break;
        }
        if ((transition >= start && dstOffsetAt(i) != 0)
                || (transition > start && dstOffsetAt(i - 1) != 0)) {
            return TRUE;
        }
    }
    return FALSE;
}